

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QDockAreaLayoutItem *item)

{
  QLayoutItem *pQVar1;
  Data *pDVar2;
  QDebug QVar3;
  Stream *__old_val;
  long lVar4;
  long *in_RDX;
  QDebug *this;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QList<QDockWidget_*> list;
  QDebugStateSaver saver;
  QDebug local_a8;
  undefined1 local_a0 [8];
  QList<QDockWidget_*> local_98;
  undefined1 local_78 [8];
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  undefined1 local_58 [8];
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  this = &local_a8;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)item);
  pQVar1 = item->widgetItem;
  *(undefined1 *)&pQVar1[3]._vptr_QLayoutItem = 0;
  QVar5.m_data = (storage_type *)0x14;
  QVar5.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
    QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
  }
  QTextStream::operator<<((QTextStream *)item->widgetItem,in_RDX);
  if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
    QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
  }
  pQVar1 = item->widgetItem;
  QVar6.m_data = (storage_type *)0x2;
  QVar6.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
    QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
  }
  if ((long *)*in_RDX == (long *)0x0) {
    if (in_RDX[1] == 0) {
      if (in_RDX[2] != 0) {
        pQVar1 = item->widgetItem;
        QVar15.m_data = (storage_type *)0x10;
        QVar15.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar15);
        QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
        }
        QTextStream::operator<<((QTextStream *)item->widgetItem,(void *)in_RDX[2]);
        if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
        }
        pQVar1 = item->widgetItem;
        QVar16.m_data = (storage_type *)0x1;
        QVar16.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar16);
        QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
        }
      }
      goto LAB_003f5b95;
    }
    pQVar1 = item->widgetItem;
    QVar9.m_data = (storage_type *)0x8;
    QVar9.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
      QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
    }
    QTextStream::operator<<((QTextStream *)item->widgetItem,(void *)in_RDX[1]);
    if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
      QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
    }
    pQVar1 = item->widgetItem;
    QVar10.m_data = (storage_type *)0x3;
    QVar10.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
      QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
    }
    local_48[0] = (QArrayData *)item->widgetItem;
    (((Alignment *)&local_48[0][2].alloc)->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (((Alignment *)&local_48[0][2].alloc)->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
         super_QFlagsStorage<Qt::AlignmentFlag>.i + 1;
    local_a8.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<QDockAreaLayoutItem>>
              ((QtPrivate *)&local_98,(Stream *)local_48,"QList",
               (QList<QDockAreaLayoutItem> *)(in_RDX[1] + 0x40));
    QDebug::~QDebug((QDebug *)local_48);
    pDVar2 = local_98.d.d;
    QVar11.m_data = (storage_type *)0x1;
    QVar11.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)pDVar2,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if ((char)local_98.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01'
       ) {
      QTextStream::operator<<((QTextStream *)local_98.d.d,' ');
    }
    QDebug::~QDebug((QDebug *)&local_98);
  }
  else {
    (**(code **)(*(long *)*in_RDX + 0x68))();
    lVar4 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (lVar4 == 0) {
      lVar4 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (lVar4 == 0) {
        pQVar1 = item->widgetItem;
        QVar17.m_data = &DAT_0000000b;
        QVar17.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar17);
        QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
        }
        local_a0 = (undefined1  [8])item->widgetItem;
        (((QLayoutItem *)((long)local_a0 + 0x20))->align).
        super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (((QLayoutItem *)((long)local_a0 + 0x20))->align).
             super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.
             i + 1;
        operator<<((Stream *)&local_98,(QWidget *)local_a0);
        pDVar2 = local_98.d.d;
        QVar18.m_data = (storage_type *)0x1;
        QVar18.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar18);
        QTextStream::operator<<((QTextStream *)pDVar2,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if ((char)local_98.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_98.d.d,' ');
        }
        QDebug::~QDebug((QDebug *)&local_98);
        this = (QDebug *)local_a0;
      }
      else {
        pQVar1 = item->widgetItem;
        QVar12.m_data = &DAT_0000000b;
        QVar12.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar12);
        QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
        }
        local_78 = (undefined1  [8])item->widgetItem;
        (((QLayoutItem *)((long)local_78 + 0x20))->align).
        super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (((QLayoutItem *)((long)local_78 + 0x20))->align).
             super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.
             i + 1;
        operator<<((Stream *)&local_70,(QWidget *)local_78);
        QVar3.stream = local_70.stream;
        QVar13.m_data = (storage_type *)0x3;
        QVar13.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar13);
        QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        local_68.stream = local_70.stream;
        *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (QDockWidget **)0x0;
        local_98.d.size = 0;
        qt_qFindChildren_helper(lVar4,0,0,&QDockWidget::staticMetaObject,&local_98,1);
        local_48[0] = (QArrayData *)local_68.stream;
        local_68.stream = (Stream *)0x0;
        QtPrivate::printSequentialContainer<QList<QDockWidget*>>
                  ((QtPrivate *)&local_60,(Stream *)local_48,"QList",&local_98);
        QDebug::~QDebug((QDebug *)local_48);
        QVar3.stream = local_60.stream;
        QVar14.m_data = (storage_type *)0x2;
        QVar14.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar14);
        QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_60.stream,' ');
        }
        QDebug::~QDebug(&local_60);
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,8,0x10);
          }
        }
        QDebug::~QDebug(&local_68);
        QDebug::~QDebug(&local_70);
        this = (QDebug *)local_78;
      }
    }
    else {
      pQVar1 = item->widgetItem;
      QVar7.m_data = &DAT_0000000b;
      QVar7.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
        QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
      }
      local_58 = (undefined1  [8])item->widgetItem;
      (((QLayoutItem *)((long)local_58 + 0x20))->align).
      super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (((QLayoutItem *)((long)local_58 + 0x20))->align).
           super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i
           + 1;
      operator<<((Stream *)&local_98,(QDockWidget *)local_58);
      pDVar2 = local_98.d.d;
      QVar8.m_data = (storage_type *)0x1;
      QVar8.m_size = (qsizetype)local_48;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)pDVar2,(QString *)local_48);
      if (local_48[0] != (QArrayData *)0x0) {
        LOCK();
        (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48[0],2,0x10);
        }
      }
      if ((char)local_98.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_98.d.d,' ');
      }
      QDebug::~QDebug((QDebug *)&local_98);
      this = (QDebug *)local_58;
    }
  }
  QDebug::~QDebug(this);
LAB_003f5b95:
  pQVar1 = item->widgetItem;
  QVar19.m_data = (storage_type *)0x1;
  QVar19.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar19);
  QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
    QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
  }
  pQVar1 = item->widgetItem;
  item->widgetItem = (QLayoutItem *)0x0;
  *(QLayoutItem **)dbg.stream = pQVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QDockAreaLayoutItem &item)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QDockAreaLayoutItem(" << static_cast<const void *>(&item) << "->";
    if (item.widgetItem) {
        QWidget *widget = item.widgetItem->widget();
        if (auto *dockWidget = qobject_cast<QDockWidget *>(widget)) {
            dbg << "widgetItem(" << dockWidget << ")";
        } else if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            dbg << "widgetItem(" << groupWindow << "->(" << groupWindow->dockWidgets() << "))";
        } else {
            dbg << "widgetItem(" << widget << ")";
        }
    } else if (item.subinfo) {
        dbg << "subInfo(" << item.subinfo << "->(" << item.subinfo->item_list << ")";
    } else if (item.placeHolderItem) {
        dbg << "placeHolderItem(" << item.placeHolderItem << ")";
    }
    dbg << ")";
    return dbg;
}